

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O1

bool iDynTree::moveLinkFramesToBeCompatibleWithURDFWithGivenBaseLink
               (Model *inputModel,Model *outputModel)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  Link *this;
  LinkIndex LVar5;
  IJoint *pIVar6;
  long *plVar7;
  mapped_type *this_00;
  RevoluteJoint *revJoint;
  ulong uVar8;
  double dVar9;
  string childLinkName;
  undefined1 local_228 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  consideredJoints;
  Traversal fullTraversal;
  Axis axis;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
  newLink_H_oldLink;
  Position newLink_o_oldLink;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  removedJointPositions;
  Position oldLink_o_newLink;
  Rotation local_78 [72];
  
  consideredJoints.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  consideredJoints.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  consideredJoints.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  while( true ) {
    sVar4 = Model::getNrOfJoints(inputModel);
    if (sVar4 <= uVar8) break;
    Model::getJointName_abi_cxx11_((string *)&fullTraversal,inputModel,uVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &consideredJoints,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fullTraversal);
    if (fullTraversal.links.
        super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&fullTraversal.links.
                  super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(fullTraversal.links.
                      super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)fullTraversal.links.
                            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    uVar8 = uVar8 + 1;
  }
  removedJointPositions._M_h._M_buckets = &removedJointPositions._M_h._M_single_bucket;
  removedJointPositions._M_h._M_bucket_count = 1;
  removedJointPositions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  removedJointPositions._M_h._M_element_count = 0;
  removedJointPositions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  removedJointPositions._M_h._M_rehash_policy._M_next_resize = 0;
  removedJointPositions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  newLink_H_oldLink._M_h._M_buckets = &newLink_H_oldLink._M_h._M_single_bucket;
  newLink_H_oldLink._M_h._M_bucket_count = 1;
  newLink_H_oldLink._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  newLink_H_oldLink._M_h._M_element_count = 0;
  newLink_H_oldLink._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  newLink_H_oldLink._M_h._M_rehash_policy._M_next_resize = 0;
  newLink_H_oldLink._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Traversal::Traversal(&fullTraversal);
  bVar1 = Model::computeFullTreeTraversal(inputModel,&fullTraversal);
  if (bVar1) {
    uVar8 = 1;
    while( true ) {
      uVar2 = Traversal::getNrOfVisitedLinks(&fullTraversal);
      if (uVar2 <= uVar8) break;
      this = Traversal::getLink(&fullTraversal,uVar8);
      LVar5 = Link::getIndex(this);
      Model::getLinkName_abi_cxx11_(&childLinkName,inputModel,LVar5);
      Traversal::getParentLink(&fullTraversal,uVar8);
      pIVar6 = Traversal::getParentJoint(&fullTraversal,uVar8);
      iVar3 = (*pIVar6->_vptr_IJoint[4])(pIVar6);
      if (iVar3 != 0) {
        iDynTree::Position::Position(&axis.origin);
        plVar7 = (long *)__dynamic_cast(pIVar6,&IJoint::typeinfo,&RevoluteJoint::typeinfo,0);
        if (plVar7 == (long *)0x0) {
          plVar7 = (long *)__dynamic_cast(pIVar6,&IJoint::typeinfo,&PrismaticJoint::typeinfo,0);
          if (plVar7 != (long *)0x0) {
            LVar5 = Link::getIndex(this);
            (**(code **)(*plVar7 + 0x138))(local_228,plVar7,LVar5);
            iDynTree::Axis::operator=(&axis,(Axis *)local_228);
          }
        }
        else {
          LVar5 = Link::getIndex(this);
          (**(code **)(*plVar7 + 0x138))(local_228,plVar7,LVar5);
          iDynTree::Axis::operator=(&axis,(Axis *)local_228);
        }
        iDynTree::Position::Zero();
        dVar9 = (double)iDynTree::Axis::getDistanceBetweenAxisAndPoint((Position *)&axis);
        if (1e-07 < dVar9) {
          iDynTree::Position::Zero();
          iDynTree::Axis::getPointOnAxisClosestToGivenPoint(&oldLink_o_newLink);
          iDynTree::Position::operator-(&newLink_o_oldLink);
          iDynTree::Rotation::Identity();
          iDynTree::Transform::Transform((Transform *)local_228,local_78,&newLink_o_oldLink);
          this_00 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&newLink_H_oldLink,&childLinkName);
          iDynTree::Transform::operator=(this_00,(Transform *)local_228);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)childLinkName._M_dataplus._M_p != &childLinkName.field_2) {
        operator_delete(childLinkName._M_dataplus._M_p,
                        childLinkName.field_2._M_allocated_capacity + 1);
      }
      uVar8 = uVar8 + 1;
    }
    local_228._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_228._8_8_ = (pointer)0x0;
    local_218[0]._M_dataplus._M_p = (pointer)0x0;
    bVar1 = createReducedModelAndChangeLinkFrames
                      (inputModel,&consideredJoints,outputModel,&removedJointPositions,
                       &newLink_H_oldLink,false,true,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_228);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228);
    if (bVar1) {
      LVar5 = Model::getDefaultBaseLink(inputModel);
      Model::getLinkName_abi_cxx11_((string *)local_228,inputModel,LVar5);
      LVar5 = Model::getLinkIndex(outputModel,(string *)local_228);
      Model::setDefaultBaseLink(outputModel,LVar5);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_ !=
          local_218) {
        operator_delete((void *)local_228._0_8_,(ulong)((long)local_218[0]._M_dataplus._M_p + 1));
      }
    }
  }
  else {
    bVar1 = false;
  }
  Traversal::~Traversal(&fullTraversal);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&newLink_H_oldLink._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&removedJointPositions._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&consideredJoints);
  return bVar1;
}

Assistant:

bool moveLinkFramesToBeCompatibleWithURDFWithGivenBaseLink(const iDynTree::Model& inputModel,
                                                                 iDynTree::Model& outputModel)
{

    // In this transformer we do not remove any joint, so the list of considered joints is exactly the list of joints in the input model
    std::vector<std::string> consideredJoints;
    for(iDynTree::JointIndex jntIdx=0; jntIdx < inputModel.getNrOfJoints(); jntIdx++)
    {
        consideredJoints.push_back(inputModel.getJointName(jntIdx));
    }

    // As we do not remove any joint, this map is empty
    std::unordered_map<std::string, double> removedJointPositions;

    // We now need to compute the newLink_H_oldLink transform for each link we need to transform
    std::unordered_map<std::string, iDynTree::Transform> newLink_H_oldLink;

    // First of all, compute the traversal for the default base of the model
    iDynTree::Traversal fullTraversal;
    bool ok = inputModel.computeFullTreeTraversal(fullTraversal);

    if (!ok)
    {
        return false;
    }

    // We start from 1 as the first link does not have any joint to the aparent link
    for (iDynTree::TraversalIndex trvIdx=1; trvIdx < static_cast<TraversalIndex>(fullTraversal.getNrOfVisitedLinks()); trvIdx++)
    {
        LinkConstPtr childLink = fullTraversal.getLink(trvIdx);
        std::string childLinkName = inputModel.getLinkName(childLink->getIndex());
        LinkConstPtr parentLink = fullTraversal.getParentLink(trvIdx);
        IJointConstPtr jointToParent = fullTraversal.getParentJoint(trvIdx);


        if (jointToParent->getNrOfDOFs() != 0)
        {
            iDynTree::Axis axis;

            // Check that the axis of the joint is supported by URDF
            if (dynamic_cast<const RevoluteJoint*>(jointToParent))
            {
                const RevoluteJoint* revJoint = dynamic_cast<const RevoluteJoint*>(jointToParent);
                axis = revJoint->getAxis(childLink->getIndex());
            }
            else if (dynamic_cast<const PrismaticJoint*>(jointToParent))
            {
                const PrismaticJoint* prismJoint = dynamic_cast<const PrismaticJoint*>(jointToParent);
                axis = prismJoint->getAxis(childLink->getIndex());
            }

            // If the axis is not URDF-compatible, move it to ensure that the new link frame lays on the
            // The threshold of 1e-7 is the same used in URDFStringFromModel, if you change it here also change it there
            double distanceBetweenAxisAndOrigin = axis.getDistanceBetweenAxisAndPoint(iDynTree::Position::Zero());
            if (distanceBetweenAxisAndOrigin > 1e-7)
            {

                // First of all, we get the point on the child axis closest to the existing origin
                iDynTree::Position oldLink_o_newLink = axis.getPointOnAxisClosestToGivenPoint(iDynTree::Position::Zero());

                // We invert the sign
                iDynTree::Position newLink_o_oldLink = -oldLink_o_newLink;


                newLink_H_oldLink[childLinkName] = iDynTree::Transform(iDynTree::Rotation::Identity(), newLink_o_oldLink);
            }
        }
    }

    bool addOriginalLinkFrameWith_original_frame_suffix = true;
    bool includeAllAdditionalFrames = true;
    bool okReduced = createReducedModelAndChangeLinkFrames(inputModel, consideredJoints, outputModel,
                                                 removedJointPositions, newLink_H_oldLink, addOriginalLinkFrameWith_original_frame_suffix, includeAllAdditionalFrames, {});

    if (okReduced)
    {
        // In general createReducedModelAndChangeLinkFrames do not preserve the existance of the base link,
        // but as in this case the link existence is preserved, we also preserve the default base link
        outputModel.setDefaultBaseLink(outputModel.getLinkIndex(inputModel.getLinkName(inputModel.getDefaultBaseLink())));
        return true;
    }
    else
    {
        return false;
    }
}